

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_config.c
# Opt level: O3

char * ps_config_serialize_json(ps_config_t *config)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  
  pcVar3 = (char *)0x0;
  iVar1 = build_json(config,(char *)0x0,0);
  if (-1 < iVar1) {
    if (config->json != (char *)0x0) {
      ckd_free(config->json);
    }
    pcVar3 = (char *)__ckd_malloc__((ulong)(iVar1 + 1U),
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_config.c"
                                    ,0x214);
    config->json = pcVar3;
    iVar2 = build_json(config,pcVar3,iVar1 + 1U);
    pcVar3 = config->json;
    if (iVar2 != iVar1) {
      ckd_free(pcVar3);
      config->json = (char *)0x0;
      pcVar3 = (char *)0x0;
    }
  }
  return pcVar3;
}

Assistant:

const char *
ps_config_serialize_json(ps_config_t *config)
{
    int len = build_json(config, NULL, 0);
    if (len < 0)
        return NULL;
    if (config->json)
        ckd_free(config->json);
    config->json = ckd_malloc(len + 1);
    if (build_json(config, config->json, len + 1) != len) {
        ckd_free(config->json);
        config->json = NULL;
    }
    return config->json;
}